

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O2

bool __thiscall QAccessibleTable::isValid(QAccessibleTable *this)

{
  QAbstractItemView *pQVar1;
  QWidget *widget;
  QWidgetPrivate *pQVar2;
  bool bVar3;
  
  pQVar1 = view(this);
  if (pQVar1 == (QAbstractItemView *)0x0) {
    bVar3 = false;
  }
  else {
    widget = (QWidget *)view(this);
    pQVar2 = qt_widget_private(widget);
    bVar3 = ((pQVar2->data).field_0x12 & 4) == 0;
  }
  return bVar3;
}

Assistant:

bool QAccessibleTable::isValid() const
{
    return view() && !qt_widget_private(view())->data.in_destructor;
}